

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O3

char * SearchStdResConnTable(char *key)

{
  StdResConnTableEntry_t *pSVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char cVar6;
  
  cVar6 = *key;
  uVar4 = 0;
  if (cVar6 != '\0') {
    pcVar5 = key + 1;
    do {
      uVar2 = (int)uVar4 * 0x10 + (int)cVar6;
      uVar2 = uVar2 & 0xfffffff ^ uVar2 >> 0x18 & 0xfffffff0;
      uVar4 = (ulong)uVar2;
      cVar6 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar6 != '\0');
    uVar4 = (ulong)(uVar2 % 0xa39);
  }
  pSVar1 = StdResTblBucket[uVar4];
  while( true ) {
    if (pSVar1 == (StdResConnTableEntry_t *)0x0) {
      return (char *)0x0;
    }
    iVar3 = strcmp(key,pSVar1->key);
    if (iVar3 < 1) break;
    pSVar1 = pSVar1->next;
  }
  if (iVar3 != 0) {
    return (char *)0x0;
  }
  return pSVar1->value;
}

Assistant:

char *SearchStdResConnTable(char *key) {
   int r = 0;
   StdResConnTableEntry_t *t;

   t = StdResTblBucket[HashInStdResTbl(key)];

   while (t && (r = strcmp(key, t->key)) > 0) {
      t = t->next;
   }

   return (t ? (r ? NULL : t->value) : NULL);
}